

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRoots.cpp
# Opt level: O0

void sort(int nx,double *x)

{
  double *in_RSI;
  int in_EDI;
  
  if ((in_EDI == 2) && (in_RSI[1] <= *in_RSI && *in_RSI != in_RSI[1])) {
    std::swap<double>(in_RSI,in_RSI + 1);
  }
  if (in_EDI == 3) {
    if (in_RSI[1] <= *in_RSI && *in_RSI != in_RSI[1]) {
      std::swap<double>(in_RSI,in_RSI + 1);
    }
    if (in_RSI[2] <= in_RSI[1] && in_RSI[1] != in_RSI[2]) {
      std::swap<double>(in_RSI + 1,in_RSI + 2);
    }
    if (in_RSI[1] <= *in_RSI && *in_RSI != in_RSI[1]) {
      std::swap<double>(in_RSI,in_RSI + 1);
    }
  }
  return;
}

Assistant:

void
sort (int nx, double x[])
{
    if (nx == 2)
    {
	if (x[0] > x[1])
	    swap (x[0], x[1]);
    }

    if (nx == 3)
    {
	if (x[0] > x[1])
	    swap (x[0], x[1]);
	if (x[1] > x[2])
	    swap (x[1], x[2]);
	if (x[0] > x[1])
	    swap (x[0], x[1]);
    }
}